

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void ustring_suite::test_empty(void)

{
  bool v;
  view_type *pvVar1;
  undefined4 local_19c;
  value local_198;
  undefined1 local_192;
  value_type_conflict local_191 [2];
  undefined1 local_18f;
  value_type_conflict local_18e [2];
  undefined4 local_18c;
  size_type local_188 [3];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  local_170;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  udecoder_type decoder;
  uchar input [3];
  
  decoder.current.scan._262_1_ = 0;
  decoder.current.scan._260_2_ = 0x2222;
  trial::protocol::json::detail::basic_decoder<unsigned_char>::basic_decoder<3ul>
            ((basic_decoder<unsigned_char> *)local_140,
             (value_type_conflict (*) [3])((long)&decoder.current.scan + 0x104));
  local_148[0] = trial::protocol::json::detail::basic_decoder<unsigned_char>::code
                           ((basic_decoder<unsigned_char> *)local_140);
  local_14c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73d,"void ustring_suite::test_empty()",local_148,&local_14c);
  trial::protocol::json::detail::basic_decoder<unsigned_char>::
  string_value<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
            (&local_170,(basic_decoder<unsigned_char> *)local_140);
  v = std::__cxx11::
      basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
      empty(&local_170);
  boost::detail::test_impl
            ("decoder.string_value<ustring_type>().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73e,"void ustring_suite::test_empty()",v);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string(&local_170);
  pvVar1 = trial::protocol::json::detail::basic_decoder<unsigned_char>::literal
                     ((basic_decoder<unsigned_char> *)local_140);
  local_188[0] = trial::protocol::core::detail::span<unsigned_char>::size(pvVar1);
  local_18c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.literal().size()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x73f,"void ustring_suite::test_empty()",local_188,&local_18c);
  pvVar1 = trial::protocol::json::detail::basic_decoder<unsigned_char>::literal
                     ((basic_decoder<unsigned_char> *)local_140);
  local_18e[0] = trial::protocol::core::detail::span<unsigned_char>::operator[](pvVar1,0);
  local_18f = 0x22;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,char>
            ("decoder.literal()[0]","\'\"\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x740,"void ustring_suite::test_empty()",local_18e,&local_18f);
  pvVar1 = trial::protocol::json::detail::basic_decoder<unsigned_char>::literal
                     ((basic_decoder<unsigned_char> *)local_140);
  local_191[0] = trial::protocol::core::detail::span<unsigned_char>::operator[](pvVar1,1);
  local_192 = 0x22;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,char>
            ("decoder.literal()[1]","\'\"\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x741,"void ustring_suite::test_empty()",local_191,&local_192);
  trial::protocol::json::detail::basic_decoder<unsigned_char>::next
            ((basic_decoder<unsigned_char> *)local_140);
  local_198 = trial::protocol::json::detail::basic_decoder<unsigned_char>::code
                        ((basic_decoder<unsigned_char> *)local_140);
  local_19c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x743,"void ustring_suite::test_empty()",&local_198,&local_19c);
  return;
}

Assistant:

void test_empty()
{
    const unsigned char input[] = { '"', '"', 0 };
    udecoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST(decoder.string_value<ustring_type>().empty());
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal().size(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal()[0], '"');
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.literal()[1], '"');
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}